

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_mtfsb0(DisasContext_conflict10 *ctx)

{
  if (ctx->fpu_enabled != false) {
    gen_mtfsb0_cold_1();
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_mtfsb0(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint8_t crb;

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    crb = 31 - crbD(ctx->opcode);
    gen_reset_fpstatus(tcg_ctx);
    if (likely(crb != FPSCR_FEX && crb != FPSCR_VX)) {
        TCGv_i32 t0;
        t0 = tcg_const_i32(tcg_ctx, crb);
        gen_helper_fpscr_clrbit(tcg_ctx, tcg_ctx->cpu_env, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        tcg_gen_trunc_tl_i32(tcg_ctx, cpu_crf[1], cpu_fpscr);
        tcg_gen_shri_i32(tcg_ctx, cpu_crf[1], cpu_crf[1], FPSCR_OX);
    }
}